

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

String * Time::toString(String *__return_storage_ptr__,int64 time,char *format,bool utc)

{
  char *__s;
  usize uVar1;
  size_t length;
  tm *local_78;
  usize len;
  char *buffer;
  tm *tms;
  time_t timet;
  char *pcStack_20;
  bool utc_local;
  char *format_local;
  int64 time_local;
  String *result;
  
  timet._7_1_ = utc;
  pcStack_20 = format;
  format_local = (char *)time;
  time_local = (int64)__return_storage_ptr__;
  if (*format == '\0') {
    String::String(__return_storage_ptr__);
  }
  else {
    tms = (tm *)(time / 1000);
    if (utc) {
      local_78 = gmtime((time_t *)&tms);
    }
    else {
      local_78 = localtime((time_t *)&tms);
    }
    String::String(__return_storage_ptr__,0x100);
    if (local_78 != (tm *)0x0) {
      while( true ) {
        __s = String::operator_cast_to_char_(__return_storage_ptr__);
        uVar1 = String::capacity(__return_storage_ptr__);
        length = strftime(__s,uVar1,pcStack_20,local_78);
        if (length != 0) break;
        uVar1 = String::capacity(__return_storage_ptr__);
        String::reserve(__return_storage_ptr__,uVar1 * 2);
      }
      String::resize(__return_storage_ptr__,length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String Time::toString(int64 time, const char* format, bool utc)
{
  if(!*format)
    return String();
  time_t timet = (time_t)(time / 1000);
  const tm* tms = utc ? ::gmtime(&timet) : ::localtime(&timet);
  String result(256);
  if(!tms)
    return result;
  char* buffer;
  usize len;
  for(;;)
  {
    buffer = result;
    len = strftime(buffer, result.capacity(), format, tms);
    if(len > 0)
      break;
    result.reserve(result.capacity() * 2);
  }
  result.resize(len);
  return result;
}